

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> * __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::operator=
          (ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *this,
          ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *other)

{
  DataLocation *pDVar1;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *pRVar2;
  DataLocation *pDVar3;
  
  pDVar1 = this->ptr;
  if (pDVar1 != (DataLocation *)0x0) {
    pRVar2 = this->pos;
    pDVar3 = this->endPtr;
    this->ptr = (DataLocation *)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *)
                0x0;
    this->endPtr = (DataLocation *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pDVar1,8,(long)pRVar2 - (long)pDVar1 >> 3,
               (long)pDVar3 - (long)pDVar1 >> 3,0);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (DataLocation *)0x0;
  other->pos = (RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *)
               0x0;
  other->endPtr = (DataLocation *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }